

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

int variance_final_from_32bit_sum_avx2(__m256i vsse,__m128i vsum,uint *sse)

{
  undefined1 auVar1 [16];
  __m256i val;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined4 *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar4 [16];
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  __m128i res;
  __m128i sse_sum;
  __m128i sse_sum_hi;
  __m128i sse_sum_lo;
  __m128i sse_reg_128;
  undefined1 in_stack_fffffffffffffe80 [16];
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 local_50;
  
  val._8_16_ = in_stack_fffffffffffffe80;
  val[0] = 0x635f21;
  val[3]._0_4_ = in_stack_fffffffffffffe90;
  val[3]._4_4_ = in_stack_fffffffffffffe94;
  mm256_add_hi_lo_epi32(val);
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = in_XMM1_Qa;
  auVar4 = vpunpckldq_avx(auVar4,auVar1);
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = in_XMM1_Qa;
  auVar1 = vpunpckhdq_avx(auVar3,auVar2);
  auVar1 = vpaddd_avx(auVar4,auVar1);
  auVar4 = vpsrldq_avx(auVar1,8);
  auVar1 = vpaddd_avx(auVar1,auVar4);
  local_50 = auVar1._0_4_;
  *in_RDI = local_50;
  return auVar1._4_4_;
}

Assistant:

static inline int variance_final_from_32bit_sum_avx2(__m256i vsse, __m128i vsum,
                                                     unsigned int *const sse) {
  // extract the low lane and add it to the high lane
  const __m128i sse_reg_128 = mm256_add_hi_lo_epi32(vsse);

  // unpack sse and sum registers and add
  const __m128i sse_sum_lo = _mm_unpacklo_epi32(sse_reg_128, vsum);
  const __m128i sse_sum_hi = _mm_unpackhi_epi32(sse_reg_128, vsum);
  const __m128i sse_sum = _mm_add_epi32(sse_sum_lo, sse_sum_hi);

  // perform the final summation and extract the results
  const __m128i res = _mm_add_epi32(sse_sum, _mm_srli_si128(sse_sum, 8));
  *((int *)sse) = _mm_cvtsi128_si32(res);
  return _mm_extract_epi32(res, 1);
}